

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::AssertionResultData::reconstructExpression_abi_cxx11_(AssertionResultData *this)

{
  bool bVar1;
  ulong uVar2;
  ReusableStringStream *in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  ReusableStringStream rss;
  ReusableStringStream *in_stack_ffffffffffffff78;
  ReusableStringStream *this_00;
  NonCopyable in_stack_ffffffffffffffb0;
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) != 0) &&
     (bVar1 = LazyExpression::operator_cast_to_bool((LazyExpression *)&in_RSI[2].m_oss), bVar1)) {
    this_00 = (ReusableStringStream *)&stack0xffffffffffffffb0;
    ReusableStringStream::ReusableStringStream
              ((ReusableStringStream *)in_stack_ffffffffffffffb0._vptr_NonCopyable);
    ReusableStringStream::operator<<(this_00,(LazyExpression *)in_stack_ffffffffffffff78);
    ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffff78);
    std::__cxx11::string::operator=((string *)&in_RSI[1].m_index,local_28);
    std::__cxx11::string::~string(local_28);
    ReusableStringStream::~ReusableStringStream(in_RSI);
  }
  std::__cxx11::string::string((string *)in_RDI,(string *)&in_RSI[1].m_index);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::string AssertionResultData::reconstructExpression() const {

        if( reconstructedExpression.empty() ) {
            if( lazyExpression ) {
                ReusableStringStream rss;
                rss << lazyExpression;
                reconstructedExpression = rss.str();
            }
        }
        return reconstructedExpression;
    }